

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O2

void gflags::anon_unknown_5::
     Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedTwiceOnCommandLine::Run(void)

{
  int32 iVar1;
  char *pcVar2;
  FlagSaver fs;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","ParseCommandLineFlagsUsesLastDefinitionTest",
          "WhenFlagIsDefinedTwiceOnCommandLine");
  iVar1 = ParseTestFlag(true,3,&PTR_anon_var_dwarf_1d5bf_00155c30);
  if (iVar1 == 2) {
    iVar1 = ParseTestFlag(false,3,&PTR_anon_var_dwarf_1d5bf_00155c30);
    if (iVar1 == 2) {
      FlagSaver::~FlagSaver(&fs);
      return;
    }
    pcVar2 = "ParseTestFlag(false, (sizeof(argv)/sizeof(*(argv))) - 1, argv)";
  }
  else {
    pcVar2 = "ParseTestFlag(true, (sizeof(argv)/sizeof(*(argv))) - 1, argv)";
  }
  fprintf(_stderr,"Check failed: %s %s %s\n","2","==",pcVar2);
  exit(1);
}

Assistant:

TEST(ParseCommandLineFlagsUsesLastDefinitionTest,
     WhenFlagIsDefinedTwiceOnCommandLine) {
  const char* argv[] = {
    "my_test",
    "--test_flag=1",
    "--test_flag=2",
    NULL,
  };

  EXPECT_EQ(2, ParseTestFlag(true, arraysize(argv) - 1, argv));
  EXPECT_EQ(2, ParseTestFlag(false, arraysize(argv) - 1, argv));
}